

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::CommissionerImpl::EncodeCommissionerDataset
                  (Error *__return_storage_ptr__,Request *aRequest,CommissionerDataset *aDataset)

{
  CommissionerDataset *pCVar1;
  bool bVar2;
  Error *pEVar3;
  ErrorCode local_2ac;
  Tlv local_2a8;
  Error local_288;
  ErrorCode local_25c;
  Tlv local_258;
  Error local_238;
  ErrorCode local_20c;
  Tlv local_208;
  Error local_1e8;
  ErrorCode local_1bc;
  Tlv local_1b8;
  Error local_198;
  ErrorCode local_16c;
  Tlv local_168;
  Error local_148;
  ErrorCode local_11c;
  Tlv local_118;
  Error local_f8;
  ErrorCode local_cc;
  Tlv local_c8;
  Error local_a8;
  ErrorCode local_80 [4];
  Tlv local_70;
  Error local_50;
  undefined1 local_21;
  CommissionerDataset *local_20;
  CommissionerDataset *aDataset_local;
  Request *aRequest_local;
  Error *error;
  
  local_21 = 0;
  local_20 = aDataset;
  aDataset_local = (CommissionerDataset *)aRequest;
  aRequest_local = (Request *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  pCVar1 = aDataset_local;
  if ((local_20->mPresentFlags & 0x4000) != 0) {
    tlv::Tlv::Tlv(&local_70,kCommissionerSessionId,local_20->mSessionId,kMeshCoP);
    AppendTlv(&local_50,(Message *)pCVar1,&local_70);
    pEVar3 = Error::operator=(__return_storage_ptr__,&local_50);
    local_80[0] = kNone;
    bVar2 = commissioner::operator!=(pEVar3,local_80);
    Error::~Error(&local_50);
    tlv::Tlv::~Tlv(&local_70);
    if (bVar2) {
      return __return_storage_ptr__;
    }
  }
  pCVar1 = aDataset_local;
  if ((local_20->mPresentFlags & 0x8000) != 0) {
    tlv::Tlv::Tlv(&local_c8,kBorderAgentLocator,local_20->mBorderAgentLocator,kMeshCoP);
    AppendTlv(&local_a8,(Message *)pCVar1,&local_c8);
    pEVar3 = Error::operator=(__return_storage_ptr__,&local_a8);
    local_cc = kNone;
    bVar2 = commissioner::operator!=(pEVar3,&local_cc);
    Error::~Error(&local_a8);
    tlv::Tlv::~Tlv(&local_c8);
    if (bVar2) {
      return __return_storage_ptr__;
    }
  }
  pCVar1 = aDataset_local;
  if ((local_20->mPresentFlags & 0x2000) != 0) {
    tlv::Tlv::Tlv(&local_118,kNetworkDiagIpv6Address,&local_20->mSteeringData,kMeshCoP);
    AppendTlv(&local_f8,(Message *)pCVar1,&local_118);
    pEVar3 = Error::operator=(__return_storage_ptr__,&local_f8);
    local_11c = kNone;
    bVar2 = commissioner::operator!=(pEVar3,&local_11c);
    Error::~Error(&local_f8);
    tlv::Tlv::~Tlv(&local_118);
    if (bVar2) {
      return __return_storage_ptr__;
    }
  }
  pCVar1 = aDataset_local;
  if ((local_20->mPresentFlags & 0x1000) != 0) {
    tlv::Tlv::Tlv(&local_168,kAeSteeringData,&local_20->mAeSteeringData,kMeshCoP);
    AppendTlv(&local_148,(Message *)pCVar1,&local_168);
    pEVar3 = Error::operator=(__return_storage_ptr__,&local_148);
    local_16c = kNone;
    bVar2 = commissioner::operator!=(pEVar3,&local_16c);
    Error::~Error(&local_148);
    tlv::Tlv::~Tlv(&local_168);
    if (bVar2) {
      return __return_storage_ptr__;
    }
  }
  pCVar1 = aDataset_local;
  if ((local_20->mPresentFlags & 0x800) != 0) {
    tlv::Tlv::Tlv(&local_1b8,kNmkpSteeringData,&local_20->mNmkpSteeringData,kMeshCoP);
    AppendTlv(&local_198,(Message *)pCVar1,&local_1b8);
    pEVar3 = Error::operator=(__return_storage_ptr__,&local_198);
    local_1bc = kNone;
    bVar2 = commissioner::operator!=(pEVar3,&local_1bc);
    Error::~Error(&local_198);
    tlv::Tlv::~Tlv(&local_1b8);
    if (bVar2) {
      return __return_storage_ptr__;
    }
  }
  pCVar1 = aDataset_local;
  if ((local_20->mPresentFlags & 0x400) != 0) {
    tlv::Tlv::Tlv(&local_208,kJoinerUdpPort,local_20->mJoinerUdpPort,kMeshCoP);
    AppendTlv(&local_1e8,(Message *)pCVar1,&local_208);
    pEVar3 = Error::operator=(__return_storage_ptr__,&local_1e8);
    local_20c = kNone;
    bVar2 = commissioner::operator!=(pEVar3,&local_20c);
    Error::~Error(&local_1e8);
    tlv::Tlv::~Tlv(&local_208);
    if (bVar2) {
      return __return_storage_ptr__;
    }
  }
  pCVar1 = aDataset_local;
  if ((local_20->mPresentFlags & 0x200) != 0) {
    tlv::Tlv::Tlv(&local_258,kAeUdpPort,local_20->mAeUdpPort,kMeshCoP);
    AppendTlv(&local_238,(Message *)pCVar1,&local_258);
    pEVar3 = Error::operator=(__return_storage_ptr__,&local_238);
    local_25c = kNone;
    bVar2 = commissioner::operator!=(pEVar3,&local_25c);
    Error::~Error(&local_238);
    tlv::Tlv::~Tlv(&local_258);
    if (bVar2) {
      return __return_storage_ptr__;
    }
  }
  pCVar1 = aDataset_local;
  if ((local_20->mPresentFlags & 0x100) != 0) {
    tlv::Tlv::Tlv(&local_2a8,kNmkpUdpPort,local_20->mNmkpUdpPort,kMeshCoP);
    AppendTlv(&local_288,(Message *)pCVar1,&local_2a8);
    pEVar3 = Error::operator=(__return_storage_ptr__,&local_288);
    local_2ac = kNone;
    commissioner::operator!=(pEVar3,&local_2ac);
    Error::~Error(&local_288);
    tlv::Tlv::~Tlv(&local_2a8);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::EncodeCommissionerDataset(coap::Request &aRequest, const CommissionerDataset &aDataset)
{
    Error error;

    if (aDataset.mPresentFlags & CommissionerDataset::kSessionIdBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kCommissionerSessionId, aDataset.mSessionId}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kBorderAgentLocatorBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kBorderAgentLocator, aDataset.mBorderAgentLocator}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kSteeringDataBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kSteeringData, aDataset.mSteeringData}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kAeSteeringDataBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kAeSteeringData, aDataset.mAeSteeringData}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kNmkpSteeringDataBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kNmkpSteeringData, aDataset.mNmkpSteeringData}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kJoinerUdpPortBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kJoinerUdpPort, aDataset.mJoinerUdpPort}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kAeUdpPortBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kAeUdpPort, aDataset.mAeUdpPort}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kNmkpUdpPortBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kNmkpUdpPort, aDataset.mNmkpUdpPort}));
    }

exit:
    return error;
}